

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool slang::ast::requireLValueHelper<slang::ast::ElementSelectExpression>
               (ElementSelectExpression *expr,ASTContext *context,SourceLocation location,
               bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  string_view arg;
  bool bVar1;
  byte bVar2;
  ValueExpressionBase *pVVar3;
  NetSymbol *pNVar4;
  ASTContext *astCtx;
  SourceLocation in_RDX;
  long in_RSI;
  ElementSelectExpression *in_RDI;
  ElementSelectExpression *in_R8;
  EvalContext evalCtx;
  ValueSymbol *sym;
  Diagnostic *diag;
  Expression *val;
  Type *in_stack_fffffffffffffb48;
  Diagnostic *in_stack_fffffffffffffb50;
  EvalContext *this;
  undefined6 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5e;
  undefined1 in_stack_fffffffffffffb5f;
  SourceLocation in_stack_fffffffffffffb60;
  SourceLocation in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  DiagCode in_stack_fffffffffffffb74;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  undefined8 in_stack_fffffffffffffb80;
  DiagCode code;
  undefined6 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8e;
  bool bVar5;
  undefined1 in_stack_fffffffffffffb8f;
  Diagnostic *in_stack_fffffffffffffb90;
  bitmask<slang::ast::EvalFlags> flags_00;
  size_t in_stack_fffffffffffffb98;
  not_null<const_slang::ast::Scope_*> in_stack_fffffffffffffba0;
  ElementSelectExpression *in_stack_fffffffffffffba8;
  Expression *in_stack_fffffffffffffca8;
  ASTContext *in_stack_fffffffffffffcb0;
  Expression *in_stack_fffffffffffffcb8;
  bitmask<slang::ast::AssignFlags> in_stack_fffffffffffffcc7;
  SourceLocation in_stack_fffffffffffffcc8;
  Expression *in_stack_fffffffffffffee8;
  ASTContext *in_stack_fffffffffffffef0;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffffeff;
  bitmask<slang::ast::EvalFlags> local_f9 [41];
  bitmask<slang::ast::ASTFlags> local_d0;
  SourceLocation local_c8;
  SourceLocation local_c0;
  SourceLocation local_b8;
  undefined4 local_ac;
  SourceLocation local_a8;
  bitmask<slang::ast::AssignFlags> local_99;
  size_t local_98;
  char *local_90;
  SourceLocation local_88;
  SourceLocation local_80;
  undefined4 local_74;
  ValueSymbol *local_70;
  SourceLocation local_68;
  SourceLocation local_60;
  SourceLocation local_58;
  undefined4 local_4c;
  Diagnostic *local_48;
  SourceLocation local_40;
  Expression *local_38;
  ElementSelectExpression *local_30;
  long local_28;
  ElementSelectExpression *local_20;
  SourceLocation local_10;
  
  code = SUB84((ulong)in_stack_fffffffffffffb80 >> 0x20,0);
  local_30 = in_R8;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_10 = in_RDX;
  local_38 = ElementSelectExpression::value(in_RDI);
  if ((local_38->kind == Concatenation) || (local_38->kind == Streaming)) {
    bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xa3bf10);
    if (!bVar1) {
      local_40 = SourceRange::start(&(local_20->super_Expression).sourceRange);
      local_10 = local_40;
    }
    local_4c = 0x560007;
    local_58 = local_10;
    local_48 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb74
                                   ,in_stack_fffffffffffffb68);
    local_68 = (local_20->super_Expression).sourceRange.startLoc;
    local_60 = (local_20->super_Expression).sourceRange.endLoc;
    range.startLoc._6_1_ = in_stack_fffffffffffffb5e;
    range.startLoc._0_6_ = in_stack_fffffffffffffb58;
    range.startLoc._7_1_ = in_stack_fffffffffffffb5f;
    range.endLoc = in_stack_fffffffffffffb60;
    Diagnostic::operator<<(in_stack_fffffffffffffb50,range);
    return false;
  }
  bVar1 = ValueExpressionBase::isKind(local_38->kind);
  if (bVar1) {
    pVVar3 = Expression::as<slang::ast::ValueExpressionBase>(local_38);
    local_70 = pVVar3->symbol;
    if (((local_70->super_Symbol).kind == Net) &&
       (pNVar4 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0xa3c017),
       pNVar4->netType->netKind == UserDefined)) {
      local_74 = 0xa80007;
      local_88 = (local_20->super_Expression).sourceRange.startLoc;
      local_80 = (local_20->super_Expression).sourceRange.endLoc;
      sourceRange.startLoc._4_2_ = in_stack_fffffffffffffb74.subsystem;
      sourceRange.startLoc._6_2_ = in_stack_fffffffffffffb74.code;
      sourceRange.startLoc._0_4_ = in_stack_fffffffffffffb70;
      sourceRange.endLoc._0_7_ = in_stack_fffffffffffffb78;
      sourceRange.endLoc._7_1_ = in_stack_fffffffffffffb7f;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb68,code,sourceRange);
      local_98 = (local_70->super_Symbol).name._M_len;
      local_90 = (local_70->super_Symbol).name._M_str;
      arg._M_str = (char *)in_stack_fffffffffffffba0.ptr;
      arg._M_len = in_stack_fffffffffffffb98;
      Diagnostic::operator<<(in_stack_fffffffffffffb90,arg);
      return false;
    }
    bitmask<slang::ast::AssignFlags>::bitmask(&local_99,NonBlocking);
    bVar1 = bitmask<slang::ast::AssignFlags>::has
                      ((bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffb50,
                       (bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffb48);
    bVar5 = false;
    if (bVar1) {
      ValueSymbol::getType((ValueSymbol *)0xa3c106);
      bVar5 = Type::isDynamicallySizedArray(in_stack_fffffffffffffb48);
    }
    if (bVar5 != false) {
      bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xa3c12c);
      if (!bVar1) {
        local_a8 = SourceRange::start(&(local_20->super_Expression).sourceRange);
        local_10 = local_a8;
      }
      local_ac = 0x820007;
      local_b8 = local_10;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb74,
                          in_stack_fffffffffffffb68);
      local_c8 = (local_20->super_Expression).sourceRange.startLoc;
      local_c0 = (local_20->super_Expression).sourceRange.endLoc;
      range_00.startLoc._6_1_ = in_stack_fffffffffffffb5e;
      range_00.startLoc._0_6_ = in_stack_fffffffffffffb58;
      range_00.startLoc._7_1_ = in_stack_fffffffffffffb5f;
      range_00.endLoc = in_stack_fffffffffffffb60;
      Diagnostic::operator<<(in_stack_fffffffffffffb50,range_00);
      return false;
    }
    in_stack_fffffffffffffb8e = 0;
  }
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffb90 >> 0x38);
  astCtx = (ASTContext *)(local_28 + 0x10);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_d0,NonProcedural);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffb60,
                     (bitmask<slang::ast::ASTFlags> *)
                     CONCAT17(in_stack_fffffffffffffb5f,
                              CONCAT16(in_stack_fffffffffffffb5e,in_stack_fffffffffffffb58)));
  if (bVar1) {
    ElementSelectExpression::selector(local_20);
    local_f9[0].m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(local_f9);
    ASTContext::eval(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffeff);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa3c279);
    bVar2 = bVar1 ^ 0xff;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa3c296);
    if ((bVar2 & 1) != 0) {
      return false;
    }
    if (local_30 == (ElementSelectExpression *)0x0) {
      local_30 = local_20;
    }
  }
  else {
    bitmask<slang::ast::EvalFlags>::bitmask
              ((bitmask<slang::ast::EvalFlags> *)&stack0xfffffffffffffb9f,CacheResults);
    this = (EvalContext *)&stack0xfffffffffffffba0;
    EvalContext::EvalContext
              ((EvalContext *)
               CONCAT17(in_stack_fffffffffffffb8f,
                        CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)),astCtx,
               flags_00);
    bVar1 = ElementSelectExpression::isConstantSelect
                      (in_stack_fffffffffffffba8,(EvalContext *)in_stack_fffffffffffffba0.ptr);
    if (bVar1) {
      if (local_30 == (ElementSelectExpression *)0x0) {
        local_30 = local_20;
      }
    }
    else {
      local_30 = (ElementSelectExpression *)0x0;
    }
    EvalContext::~EvalContext(this);
  }
  bVar1 = Expression::requireLValue
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc7,in_stack_fffffffffffffca8);
  return bVar1;
}

Assistant:

bool requireLValueHelper(const T& expr, const ASTContext& context, SourceLocation location,
                         bitmask<AssignFlags> flags, const Expression* longestStaticPrefix) {
    auto& val = expr.value();
    if (val.kind == ExpressionKind::Concatenation || val.kind == ExpressionKind::Streaming) {
        // Selects of concatenations are not allowed to be lvalues.
        if (!location)
            location = expr.sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag << expr.sourceRange;
        return false;
    }

    if (ValueExpressionBase::isKind(val.kind)) {
        auto& sym = val.template as<ValueExpressionBase>().symbol;
        if (sym.kind == SymbolKind::Net) {
            if (sym.template as<NetSymbol>().netType.netKind == NetType::UserDefined) {
                context.addDiag(diag::UserDefPartialDriver, expr.sourceRange) << sym.name;
                return false;
            }
        }

        if (flags.has(AssignFlags::NonBlocking) && sym.getType().isDynamicallySizedArray()) {
            if (!location)
                location = expr.sourceRange.start();

            context.addDiag(diag::NonblockingDynamicAssign, location) << expr.sourceRange;
            return false;
        }
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        if constexpr (std::is_same_v<T, RangeSelectExpression>) {
            if (!context.eval(expr.left()) || !context.eval(expr.right()))
                return false;
        }
        else {
            if (!context.eval(expr.selector()))
                return false;
        }

        if (!longestStaticPrefix)
            longestStaticPrefix = &expr;
    }
    else {
        EvalContext evalCtx(context, EvalFlags::CacheResults);
        if (expr.isConstantSelect(evalCtx)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = &expr;
        }
        else {
            longestStaticPrefix = nullptr;
        }
    }

    return val.requireLValue(context, location, flags, longestStaticPrefix);
}